

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<int_const&,int_const&,int_const&,int_const&,float_const&,float_const&,pbrt::LightSampler_const&,bool_const&>
               (string *s,char *fmt,int *v,int *args,int *args_1,int *args_2,float *args_3,
               float *args_4,LightSampler *args_5,bool *args_6)

{
  long lVar1;
  int *v_00;
  ulong uVar2;
  char *in_RCX;
  string *in_RDX;
  float *unaff_RBX;
  string *in_RDI;
  int *in_R8;
  int *in_R9;
  LightSampler *unaff_R14;
  bool *unaff_retaddr;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  string *in_stack_fffffffffffffd60;
  char **in_stack_fffffffffffffd68;
  string *psVar3;
  char **in_stack_fffffffffffffd70;
  char *in_stack_fffffffffffffd78;
  int *in_stack_fffffffffffffd98;
  int *in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffdac;
  string *in_stack_fffffffffffffdb0;
  char *in_stack_fffffffffffffdb8;
  string *in_stack_fffffffffffffdc0;
  int *in_stack_fffffffffffffdd0;
  float *in_stack_fffffffffffffdd8;
  float *in_stack_fffffffffffffde0;
  LightSampler *in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffdf4;
  char *in_stack_fffffffffffffdf8;
  LogLevel in_stack_fffffffffffffe04;
  string local_98 [32];
  undefined4 local_78;
  undefined1 local_63;
  byte local_62;
  byte local_61;
  string local_60 [16];
  float *in_stack_ffffffffffffffb0;
  int *in_stack_ffffffffffffffb8;
  
  copyToFormatString(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  lVar1 = std::__cxx11::string::find((char)local_60,0x2a);
  local_61 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)local_60,0x73);
  local_62 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)local_60,100);
  local_63 = lVar1 != -1;
  if ((local_61 & 1) == 0) {
    if ((bool)local_63) {
      psVar3 = local_60;
      v_00 = (int *)std::__cxx11::string::find((char)psVar3,100);
      IntegerFormatTrait<int>::fmt();
      std::__cxx11::string::replace((ulong)psVar3,(ulong)v_00,(char *)0x1);
      std::__cxx11::string::c_str();
      formatOne<int_const&>(in_stack_fffffffffffffd78,v_00);
      std::__cxx11::string::operator+=(in_RDI,local_98);
      std::__cxx11::string::~string(local_98);
    }
    else if ((local_62 & 1) == 0) {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) != 0) {
        LogFatal(in_stack_fffffffffffffe04,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
                 (char *)in_stack_fffffffffffffde8);
      }
      std::__cxx11::string::c_str();
      formatOne<int_const&>(in_stack_fffffffffffffd78,(int *)in_stack_fffffffffffffd70);
      std::__cxx11::string::operator+=(in_RDI,(string *)&stack0xfffffffffffffd78);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd78);
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffde0);
      std::ostream::operator<<(&stack0xfffffffffffffdf0,*(int *)in_RDX);
      std::__cxx11::string::c_str();
      std::__cxx11::stringstream::str();
      std::__cxx11::string::c_str();
      formatOne<char_const*>(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
      std::__cxx11::string::operator+=(in_RDI,(string *)&stack0xfffffffffffffdc0);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffdc0);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd98);
      std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffde0);
    }
    stringPrintfRecursive<int_const&,int_const&,int_const&,float_const&,float_const&,pbrt::LightSampler_const&,bool_const&>
              (in_RDX,in_RCX,in_R8,in_R9,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
               unaff_RBX,unaff_R14,unaff_retaddr);
    local_78 = 0;
  }
  else {
    stringPrintfRecursiveWithPrecision<int_const&,int_const&,int_const&,float_const&,float_const&,pbrt::LightSampler_const&,bool_const&>
              (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
               in_stack_fffffffffffffdac,in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               in_stack_fffffffffffffdd0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffde0,
               in_stack_fffffffffffffde8,
               (bool *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
    local_78 = 1;
  }
  std::__cxx11::string::~string(local_60);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&...args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same_v<std::decay_t<T>, float>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, double>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, bool>)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}